

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

void cp_expr_sub(CPState *cp,CPValue *k,int pri)

{
  CPValue k2;
  
  cp_expr_unary(cp,k);
  (*(code *)(&DAT_0015a9a0 + *(int *)(&DAT_0015a9a0 + (ulong)(uint)pri * 4)))();
  return;
}

Assistant:

static void cp_expr_sub(CPState *cp, CPValue *k, int pri)
{
  cp_expr_unary(cp, k);
  cp_expr_infix(cp, k, pri);
}